

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remove.c
# Opt level: O1

int remove(char *__filename)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  _PDCLIB_file_t *p_Var4;
  
  p_Var4 = _PDCLIB_filelist;
  while( true ) {
    if (p_Var4 == (_PDCLIB_file_t *)0x0) {
      iVar2 = unlink(__filename);
      if (iVar2 == -1) {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        piVar3 = _PDCLIB_errno_func();
        *piVar3 = iVar1;
      }
      return iVar2;
    }
    if ((p_Var4->filename != (char *)0x0) &&
       (iVar2 = strcmp(p_Var4->filename,__filename), iVar2 == 0)) break;
    p_Var4 = p_Var4->next;
  }
  return -1;
}

Assistant:

int remove( const char * pathname )
{
    int rc;
    struct _PDCLIB_file_t * current = _PDCLIB_filelist;

    while ( current != NULL )
    {
        if ( ( current->filename != NULL ) && ( strcmp( current->filename, pathname ) == 0 ) )
        {
            return EOF;
        }

        current = current->next;
    }

    if ( ( rc = unlink( pathname ) ) == -1 )
    {
        /* The 1:1 mapping in _PDCLIB_config.h ensures this works. */
        *_PDCLIB_errno_func() = errno;
    }

    return rc;
}